

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O1

FT_Error ps_dimension_end(PS_Dimension dim,FT_UInt end_point,FT_Memory memory)

{
  PS_Mask __dest;
  FT_UInt FVar1;
  undefined4 uVar2;
  PS_Mask pPVar3;
  byte *pbVar4;
  byte *pbVar5;
  FT_Byte *pFVar6;
  FT_Byte *pFVar7;
  bool bVar8;
  FT_UInt FVar9;
  FT_UInt FVar10;
  undefined4 uVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  byte *pbVar16;
  ulong uVar17;
  byte *pbVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  undefined4 uStack_60;
  
  uVar13 = (ulong)(dim->masks).num_masks;
  if (uVar13 != 0) {
    (dim->masks).masks[uVar13 - 1].end_point = end_point;
  }
  FVar1 = (dim->counters).num_masks;
  if (1 < (long)(int)FVar1) {
    uVar23 = (ulong)(FVar1 - 2);
    uVar13 = (long)(int)FVar1;
    do {
      uVar21 = uVar13 - 1;
      pPVar3 = (dim->counters).masks;
      pbVar4 = pPVar3[uVar21].bytes;
      uVar15 = uVar23;
      while( true ) {
        pbVar5 = pPVar3[uVar15].bytes;
        uVar14 = pPVar3[uVar15].num_bits;
        if (pPVar3[uVar21].num_bits < pPVar3[uVar15].num_bits) {
          uVar14 = pPVar3[uVar21].num_bits;
        }
        uVar22 = (uint)uVar15;
        pbVar18 = pbVar5;
        pbVar16 = pbVar4;
        if (7 < uVar14) {
          uVar17 = (ulong)(uVar14 - 8 >> 3);
          pbVar16 = pbVar4 + uVar17 + 1;
          pbVar18 = pbVar5 + uVar17 + 1;
          lVar19 = 0;
          do {
            if ((pbVar4[lVar19] & pbVar5[lVar19]) != 0) goto LAB_002157e0;
            uVar14 = uVar14 - 8;
            lVar19 = lVar19 + 1;
          } while (7 < uVar14);
        }
        if ((uVar14 != 0) && (0xffU >> ((byte)uVar14 & 0x1f) < (uint)(*pbVar18 & *pbVar16))) break;
        uVar15 = uVar15 - 1;
        if ((int)uVar22 < 1) goto LAB_00215931;
      }
LAB_002157e0:
      uVar20 = (uint)uVar21;
      uVar14 = uVar20;
      if (uVar20 < uVar22) {
        uVar14 = uVar22;
      }
      if (uVar20 <= uVar22) {
        uVar15 = uVar21;
      }
      iVar12 = 0;
      if ((uVar14 <= (uint)uVar15) || ((dim->counters).num_masks <= uVar14)) goto LAB_00215929;
      __dest = pPVar3 + uVar14;
      FVar1 = __dest->num_bits;
      if (FVar1 == 0) {
        iVar12 = 0;
        goto LAB_002158be;
      }
      pPVar3 = pPVar3 + (uVar15 & 0xffffffff);
      uVar22 = pPVar3->num_bits;
      if (FVar1 <= uVar22) goto LAB_00215888;
      iVar12 = ps_mask_ensure(pPVar3,FVar1,memory);
      if (iVar12 == 0) {
        do {
          if (uVar22 < pPVar3->num_bits) {
            pPVar3->bytes[uVar22 >> 3] =
                 pPVar3->bytes[uVar22 >> 3] & (byte)(-0x81 >> ((byte)uVar22 & 7));
          }
          uVar22 = uVar22 + 1;
        } while (FVar1 != uVar22);
LAB_00215888:
        bVar8 = true;
        iVar12 = 0;
        if (7 < FVar1 + 7) {
          pFVar6 = pPVar3->bytes;
          pFVar7 = __dest->bytes;
          lVar19 = 0;
          do {
            pFVar6[lVar19] = pFVar6[lVar19] | pFVar7[lVar19];
            lVar19 = lVar19 + 1;
          } while (FVar1 + 7 >> 3 != (uint)lVar19);
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
LAB_002158be:
        __dest->num_bits = 0;
        __dest->end_point = 0;
        uVar14 = ~uVar14 + (dim->counters).num_masks;
        if (0 < (int)uVar14) {
          FVar10 = __dest->end_point;
          uVar11 = *(undefined4 *)&__dest->field_0x14;
          FVar1 = __dest->num_bits;
          FVar9 = __dest->max_bits;
          uStack_60 = (undefined4)((ulong)*(undefined8 *)&__dest->max_bits >> 0x20);
          uVar2 = *(undefined4 *)((long)&__dest->bytes + 4);
          uVar15 = (ulong)uVar14;
          memmove(__dest,__dest + 1,uVar15 * 0x18);
          pPVar3 = __dest + uVar15;
          pPVar3->num_bits = FVar1;
          pPVar3->max_bits = FVar9;
          pPVar3->bytes = (FT_Byte *)CONCAT44(uVar2,uStack_60);
          __dest[uVar15].end_point = FVar10;
          *(undefined4 *)&__dest[uVar15].field_0x14 = uVar11;
        }
        (dim->counters).num_masks = (dim->counters).num_masks - 1;
      }
LAB_00215929:
      if (iVar12 != 0) {
        return iVar12;
      }
LAB_00215931:
      uVar23 = uVar23 - 1;
      bVar8 = 2 < (long)uVar13;
      uVar13 = uVar21;
    } while (bVar8);
  }
  return 0;
}

Assistant:

static FT_Error
  ps_dimension_end( PS_Dimension  dim,
                    FT_UInt       end_point,
                    FT_Memory     memory )
  {
    /* end hint mask table */
    ps_dimension_end_mask( dim, end_point );

    /* merge all counter masks into independent "paths" */
    return ps_mask_table_merge_all( &dim->counters, memory );
  }